

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O1

void __thiscall
ear::GainCalculatorObjectsImpl::calculate
          (GainCalculatorObjectsImpl *this,ObjectsTypeMetadata *metadata,OutputGains *direct,
          OutputGains *diffuse,WarningCB *param_4)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  double dVar4;
  PolarPosition position_00;
  Index size;
  result_type pnVar5;
  not_implemented *pnVar6;
  char *__function;
  ulong uVar7;
  ActualDstType actualDst;
  ulong uVar8;
  Vector3d position;
  VectorXd pv_full;
  _Alloc_hider local_108;
  size_type in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  void *local_e0;
  long local_d8;
  CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
  local_d0;
  undefined8 local_c0;
  double *local_b8;
  long lStack_b0;
  Vector3d local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_58;
  
  if (metadata->cartesian == true) {
    pnVar6 = (not_implemented *)__cxa_allocate_exception(0x10);
    local_108._M_p = &stack0xffffffffffffff08;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"cartesian","");
    not_implemented::not_implemented(pnVar6,(string *)&local_108);
    __cxa_throw(pnVar6,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  }
  boost::variant<ear::CartesianPosition,ear::PolarPosition>::
  apply_visitor<ear::throw_if_not_implemented_const>
            ((variant<ear::CartesianPosition,ear::PolarPosition> *)metadata,
             (throw_if_not_implemented *)&local_108);
  boost::variant<ear::PolarObjectDivergence,ear::CartesianObjectDivergence>::
  apply_visitor<ear::throw_if_not_implemented_const>
            ((variant<ear::PolarObjectDivergence,ear::CartesianObjectDivergence> *)
             &metadata->objectDivergence,(throw_if_not_implemented *)&local_108);
  if ((metadata->channelLock).flag == true) {
    pnVar6 = (not_implemented *)__cxa_allocate_exception(0x10);
    local_108._M_p = &stack0xffffffffffffff08;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"channelLock","");
    not_implemented::not_implemented(pnVar6,(string *)&local_108);
    __cxa_throw(pnVar6,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((metadata->zoneExclusion).zones.
      super__Vector_base<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>,_std::allocator<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (metadata->zoneExclusion).zones.
      super__Vector_base<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>,_std::allocator<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pnVar6 = (not_implemented *)__cxa_allocate_exception(0x10);
    local_108._M_p = &stack0xffffffffffffff08;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"zoneExclusion","");
    not_implemented::not_implemented(pnVar6,(string *)&local_108);
    __cxa_throw(pnVar6,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  }
  if (metadata->screenRef == true) {
    pnVar6 = (not_implemented *)__cxa_allocate_exception(0x10);
    local_108._M_p = &stack0xffffffffffffff08;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"screenRef","");
    not_implemented::not_implemented(pnVar6,(string *)&local_108);
    __cxa_throw(pnVar6,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  }
  pnVar5 = boost::variant<ear::CartesianPosition,ear::PolarPosition>::
           apply_visitor<boost::detail::variant::get_visitor<ear::PolarPosition_const>>
                     ((variant<ear::CartesianPosition,ear::PolarPosition> *)metadata,
                      (get_visitor<const_ear::PolarPosition> *)&local_d0);
  if (pnVar5 == (result_type)0x0) {
    local_d0.m_xpr = (XprTypeNested)&PTR__exception_002106b0;
    boost::throw_exception<boost::bad_get>((bad_get *)&local_d0);
  }
  position_00.elevation = (double)in_stack_ffffffffffffff08;
  position_00.azimuth = (double)in_stack_ffffffffffffff00;
  position_00.distance = (double)in_stack_ffffffffffffff10;
  toCartesianVector3d(position_00);
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)local_108._M_p;
  local_b8 = (this->_pvTmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
  lStack_b0 = (this->_pvTmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
  if (lStack_b0 < 0 && local_b8 != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  PolarExtent::handle(&this->_polarExtentPanner,&local_98,metadata->width,metadata->height,
                      metadata->depth,
                      (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                      &local_b8);
  uVar2 = (this->_pvTmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (-1 < (long)uVar2) {
    dVar1 = metadata->gain;
    pdVar3 = (this->_pvTmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    uVar7 = uVar2 & 0x7ffffffffffffffe;
    if (1 < (long)uVar2) {
      uVar8 = 0;
      do {
        dVar4 = (pdVar3 + uVar8)[1];
        pdVar3[uVar8] = pdVar3[uVar8] * dVar1;
        (pdVar3 + uVar8)[1] = dVar4 * dVar1;
        uVar8 = uVar8 + 2;
      } while (uVar8 < uVar7);
    }
    if ((long)uVar7 < (long)uVar2) {
      do {
        pdVar3[uVar7] = pdVar3[uVar7] * dVar1;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    local_d0.m_xpr =
         (XprTypeNested)
         (this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    local_c0 = 0;
    if (-1 < (long)local_d0.m_xpr) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e0,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_d0);
      local_d0.m_xpr = &this->_isLfe;
      mask_write<Eigen::Matrix<double,_1,1,0,_1,1>&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_e0,&local_d0,&this->_pvTmp);
      dVar1 = 1.0 - metadata->diffuse;
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      if (-1 < local_d8) {
        local_58.m_rhs.m_rows.m_value = local_d8;
        local_58.m_lhs = (LhsNested)&local_e0;
        local_58.m_rhs.m_functor.m_other = dVar1;
        OutputGains::
        write_vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                  (direct,&local_58);
        dVar1 = metadata->diffuse;
        if (dVar1 < 0.0) {
          local_80.m_rhs.m_functor.m_other = sqrt(dVar1);
        }
        else {
          local_80.m_rhs.m_functor.m_other = SQRT(dVar1);
        }
        if (-1 < local_d8) {
          local_80.m_rhs.m_rows.m_value = local_d8;
          local_80.m_lhs = (LhsNested)&local_e0;
          OutputGains::
          write_vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                    (diffuse,&local_80);
          free(local_e0);
          return;
        }
      }
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_0014d089;
    }
  }
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0014d089:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,__function);
}

Assistant:

void GainCalculatorObjectsImpl::calculate(const ObjectsTypeMetadata& metadata,
                                            OutputGains& direct,
                                            OutputGains& diffuse,
                                            const WarningCB&) {
    if (metadata.cartesian) throw not_implemented("cartesian");
    boost::apply_visitor(throw_if_not_implemented(), metadata.position);
    boost::apply_visitor(throw_if_not_implemented(), metadata.objectDivergence);
    if (metadata.channelLock.flag) throw not_implemented("channelLock");
    if (metadata.zoneExclusion.zones.size())
      throw not_implemented("zoneExclusion");
    if (metadata.screenRef) throw not_implemented("screenRef");

    Eigen::Vector3d position =
        toCartesianVector3d(boost::get<PolarPosition>(metadata.position));
    _polarExtentPanner.handle(position, metadata.width, metadata.height,
                              metadata.depth, _pvTmp);
    _pvTmp *= metadata.gain;

    Eigen::VectorXd pv_full = Eigen::VectorXd::Zero(_isLfe.size());
    mask_write(pv_full, !_isLfe, _pvTmp);

    // apply diffuse split
    direct.write_vector(pv_full * std::sqrt(1.0 - metadata.diffuse));
    diffuse.write_vector(pv_full * std::sqrt(metadata.diffuse));
  }